

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

uchar __thiscall IDisk::GetNextByte(IDisk *this,int side,uint track,uint offset)

{
  uint uVar1;
  MFMTrack *pMVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  
  uVar3 = offset + 1;
  pMVar2 = this->side_[side].tracks;
  uVar1 = pMVar2[track].size;
  uVar5 = 0xfffffffe;
  bVar4 = 0;
  do {
    if (uVar1 <= uVar3) {
      uVar3 = uVar3 % uVar1;
    }
    bVar4 = pMVar2[track].bitfield[uVar3] & 1 | bVar4 * '\x02';
    uVar3 = uVar3 + 2;
    uVar5 = uVar5 + 2;
  } while (uVar5 < 0xe);
  return bVar4;
}

Assistant:

unsigned char IDisk::GetNextByte(int side, unsigned int track, unsigned int offset) const
{
   unsigned char return_value = 0;

   //
   offset++;
   for (int i = 0; i < 16; i += 2)
   {
      return_value <<= 1;
      if (offset >= side_[side].tracks[track].size)
         offset = offset % side_[side].tracks[track].size;

      const unsigned char b = side_[side].tracks[track].bitfield[offset];
      return_value |= b & 0x1;
      offset += 2;
   }

   return return_value;
}